

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

void __thiscall UdpSocketImpl::WriteThread(UdpSocketImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  atomic_uchar *paVar2;
  uint __fd;
  _Elt_pointer ptVar3;
  _Head_base<0UL,_unsigned_char_*,_false> _Var4;
  unsigned_long uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ssize_t sVar11;
  BaseSocket *pBVar12;
  int *piVar13;
  ulong uVar14;
  unsigned_long __n2;
  char cVar15;
  unsigned_long __n2_1;
  ulong uVar16;
  _Any_data *p_Var17;
  bool bVar18;
  __array tmp;
  socklen_t iLen;
  DATA data;
  addrinfo *lstAddr;
  unique_lock<std::mutex> lock;
  timeval timeout;
  fd_set errorfd;
  fd_set writefd;
  _Head_base<0UL,_unsigned_char_*,_false> local_200 [2];
  BaseSocket local_1f0;
  pthread_mutex_t *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  unsigned_long local_198;
  _Head_base<0UL,_unsigned_char_*,_false> local_190;
  addrinfo *local_188;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_180;
  _Any_data *local_178;
  _Any_data *local_170;
  unique_lock<std::mutex> local_168;
  timeval local_158;
  int *local_148;
  unique_lock *local_140;
  fd_set local_138;
  fd_set local_b8;
  
  local_168._M_device = &this->m_mxWrite;
  local_168._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_168);
  local_168._M_owns = true;
  local_140 = (unique_lock *)&this->m_cv;
  local_148 = &(this->super_BaseSocketImpl).m_iError;
  local_178 = (_Any_data *)&(this->super_BaseSocketImpl).m_fError;
  p_Var17 = (_Any_data *)&(this->super_BaseSocketImpl).m_fErrorParam;
  local_1e0 = (pthread_mutex_t *)&this->m_mxOutDeque;
  local_180 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
               *)&this->m_quOutData;
  local_170 = p_Var17;
  do {
    do {
      if ((this->m_bCloseReq != false) &&
         ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0)) goto LAB_0011cf61;
      if ((this->m_bCloseReq == false) &&
         ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0)) {
        while (((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0 &&
               (this->m_bCloseReq == false))) {
          std::condition_variable::wait(local_140);
        }
      }
    } while ((this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i == 0);
    local_158.tv_sec = 1;
    local_158.tv_usec = 0;
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    local_138.fds_bits[0xe] = 0;
    local_138.fds_bits[0xf] = 0;
    local_138.fds_bits[0xc] = 0;
    local_138.fds_bits[0xd] = 0;
    local_138.fds_bits[10] = 0;
    local_138.fds_bits[0xb] = 0;
    local_138.fds_bits[8] = 0;
    local_138.fds_bits[9] = 0;
    local_138.fds_bits[6] = 0;
    local_138.fds_bits[7] = 0;
    local_138.fds_bits[4] = 0;
    local_138.fds_bits[5] = 0;
    local_138.fds_bits[2] = 0;
    local_138.fds_bits[3] = 0;
    local_138.fds_bits[0] = 0;
    local_138.fds_bits[1] = 0;
    iVar6 = (this->super_BaseSocketImpl).m_fSock;
    iVar8 = iVar6 + 0x3f;
    if (-1 < iVar6) {
      iVar8 = iVar6;
    }
    uVar14 = 1L << ((byte)iVar6 & 0x3f);
    local_b8.fds_bits[iVar8 >> 6] = local_b8.fds_bits[iVar8 >> 6] | uVar14;
    local_138.fds_bits[iVar8 >> 6] = local_138.fds_bits[iVar8 >> 6] | uVar14;
    iVar6 = select(iVar6 + 1,(fd_set *)0x0,&local_b8,&local_138,&local_158);
    if (iVar6 == 0) {
      iVar6 = 3 - (uint)(this->m_bCloseReq == false);
    }
    else {
      __fd = (this->super_BaseSocketImpl).m_fSock;
      uVar7 = __fd + 0x3f;
      if (-1 < (int)__fd) {
        uVar7 = __fd;
      }
      if (((ulong)local_138.fds_bits[(int)uVar7 >> 6] >> ((ulong)__fd & 0x3f) & 1) == 0) {
        iVar6 = pthread_mutex_lock(local_1e0);
        if (iVar6 != 0) {
          std::__throw_system_error(iVar6);
        }
        ptVar3 = (this->m_quOutData).
                 super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_1b8._M_dataplus._M_p =
             (ptVar3->
             super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p;
        paVar1 = &(ptVar3->
                  super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).
                  super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .
                  super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                  ._M_head_impl.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p == paVar1) {
          local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_1b8.field_2._8_8_ =
               *(undefined8 *)
                ((long)&(ptVar3->
                        super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).
                        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        ._M_head_impl.field_2 + 8);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        local_1b8._M_string_length =
             (ptVar3->
             super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_string_length;
        (ptVar3->
        super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_dataplus = (_Alloc_hider)paVar1;
        (ptVar3->
        super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl._M_string_length = 0;
        (ptVar3->
        super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .
        super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        ._M_head_impl.field_2._M_local_buf[0] = '\0';
        local_198 = (ptVar3->
                    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).
                    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
        local_190._M_head_impl =
             (ptVar3->
             super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
             ._M_head_impl._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        (ptVar3->
        super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
        ._M_head_impl._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false> = (_Head_base<0UL,_unsigned_char_*,_false>)0x0
        ;
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pop_front((deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_180);
        LOCK();
        (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
             (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i - local_198;
        UNLOCK();
        pthread_mutex_unlock(local_1e0);
        local_188 = (addrinfo *)0x0;
        cVar15 = (char)&local_1b8;
        lVar9 = std::__cxx11::string::find(cVar15,0x5b);
        lVar10 = std::__cxx11::string::find(cVar15,0x5d);
        if (lVar10 == -1 || lVar9 == -1) {
          bVar18 = false;
          lVar9 = std::__cxx11::string::find(cVar15,0x3a);
          if (lVar9 == -1) {
            iVar6 = 3;
          }
          else {
            std::__cxx11::string::substr((ulong)local_200,(ulong)&local_1b8);
            _Var4._M_head_impl = local_200[0]._M_head_impl;
            std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_1b8);
            iVar6 = getaddrinfo((char *)_Var4._M_head_impl,(char *)local_1d8[0],(addrinfo *)0x0,
                                &local_188);
            bVar18 = iVar6 == 0;
            if (local_1d8[0] != local_1c8) {
              operator_delete(local_1d8[0],local_1c8[0] + 1);
            }
            if ((BaseSocket *)local_200[0]._M_head_impl != &local_1f0) {
              operator_delete(local_200[0]._M_head_impl,(long)local_1f0._vptr_BaseSocket + 1);
            }
            iVar6 = (uint)(iVar6 != 0) * 3;
          }
          if (bVar18) goto LAB_0011ccd6;
        }
        else {
          std::__cxx11::string::substr((ulong)local_200,(ulong)&local_1b8);
          _Var4._M_head_impl = local_200[0]._M_head_impl;
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_1b8);
          iVar8 = getaddrinfo((char *)_Var4._M_head_impl,(char *)local_1d8[0],(addrinfo *)0x0,
                              &local_188);
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0],local_1c8[0] + 1);
          }
          if ((BaseSocket *)local_200[0]._M_head_impl != &local_1f0) {
            operator_delete(local_200[0]._M_head_impl,(long)local_1f0._vptr_BaseSocket + 1);
          }
          iVar6 = 3;
          if (iVar8 == 0) {
LAB_0011ccd6:
            sVar11 = sendto((this->super_BaseSocketImpl).m_fSock,local_190._M_head_impl,
                            (long)(int)local_198,0,local_188->ai_addr,local_188->ai_addrlen);
            freeaddrinfo(local_188);
            uVar5 = local_198;
            if ((int)(uint)sVar11 < 1) {
              piVar13 = __errno_location();
              uVar5 = local_198;
              iVar6 = *piVar13;
              (this->super_BaseSocketImpl).m_iError = iVar6;
              if (iVar6 == 0xb) {
                pBVar12 = (BaseSocket *)operator_new__(local_198);
                memset(pBVar12,0,uVar5);
                local_200[0]._M_head_impl = (uchar *)pBVar12;
                if (uVar5 != 0) {
                  memmove(pBVar12,local_190._M_head_impl,uVar5);
                }
                iVar6 = pthread_mutex_lock(local_1e0);
                if (iVar6 != 0) {
                  std::__throw_system_error(iVar6);
                }
                LOCK();
                (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                     (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i + local_198;
                UNLOCK();
                std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                ::
                emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                          (local_180,
                           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           local_200,&local_198,&local_1b8);
                pthread_mutex_unlock(local_1e0);
                if ((BaseSocket *)local_200[0]._M_head_impl != (BaseSocket *)0x0) {
                  operator_delete__(local_200[0]._M_head_impl);
                }
                iVar6 = 0;
              }
              else {
                (this->super_BaseSocketImpl).m_iErrLoc = 6;
                bVar18 = (this->super_BaseSocketImpl).m_bStop;
                if (bVar18 == false &&
                    (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
                    (_Manager_type)0x0) {
                  local_1d8[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
                  local_200[0]._M_head_impl = (uchar *)(this->super_BaseSocketImpl).m_pBkRef;
                  (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                            (p_Var17,(BaseSocket **)local_200,local_1d8);
                  iVar6 = 3;
                }
                else {
                  iVar6 = 3;
                  if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                      (_Manager_type)0x0 && bVar18 == false) {
                    local_200[0]._M_head_impl = (uchar *)(this->super_BaseSocketImpl).m_pBkRef;
                    (*(this->super_BaseSocketImpl).m_fError._M_invoker)
                              (local_178,(BaseSocket **)local_200);
                  }
                }
              }
            }
            else {
              uVar16 = (ulong)((uint)sVar11 & 0x7fffffff);
              iVar6 = 0;
              uVar14 = local_198 - uVar16;
              p_Var17 = local_170;
              if (uVar16 <= local_198 && uVar14 != 0) {
                pBVar12 = (BaseSocket *)operator_new__(uVar14);
                memset(pBVar12,0,uVar14);
                local_200[0]._M_head_impl = (uchar *)pBVar12;
                if (uVar5 != uVar16) {
                  memmove(pBVar12,local_190._M_head_impl + uVar16,uVar14);
                }
                iVar6 = pthread_mutex_lock(local_1e0);
                p_Var17 = local_170;
                if (iVar6 != 0) {
                  std::__throw_system_error(iVar6);
                }
                LOCK();
                (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
                     (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i +
                     (local_198 - uVar16);
                UNLOCK();
                local_1d8[0] = (long *)(local_198 - uVar16);
                std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                ::
                emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string&>
                          (local_180,
                           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           local_200,(unsigned_long *)local_1d8,&local_1b8);
                pthread_mutex_unlock(local_1e0);
                iVar6 = 0;
                if ((BaseSocket *)local_200[0]._M_head_impl != (BaseSocket *)0x0) {
                  operator_delete__(local_200[0]._M_head_impl);
                }
              }
            }
          }
        }
        if (local_190._M_head_impl != (uchar *)0x0) {
          operator_delete__(local_190._M_head_impl);
        }
        local_190._M_head_impl = (uchar *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar6 = 3;
        if (*local_148 == 0) {
          local_1d8[0] = (long *)CONCAT44(local_1d8[0]._4_4_,4);
          getsockopt(__fd,1,4,local_148,(socklen_t *)local_1d8);
          (this->super_BaseSocketImpl).m_iErrLoc = 5;
          bVar18 = (this->super_BaseSocketImpl).m_bStop;
          if (bVar18 == false &&
              (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            local_200[0]._M_head_impl = (uchar *)(this->super_BaseSocketImpl).m_pvUserData;
            local_1b8._M_dataplus._M_p = (pointer)(this->super_BaseSocketImpl).m_pBkRef;
            (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                      (p_Var17,(BaseSocket **)&local_1b8,&local_200[0]._M_head_impl);
          }
          else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                   (_Manager_type)0x0 && bVar18 == false) {
            local_1b8._M_dataplus._M_p = (pointer)(this->super_BaseSocketImpl).m_pBkRef;
            (*(this->super_BaseSocketImpl).m_fError._M_invoker)(local_178,(BaseSocket **)&local_1b8)
            ;
          }
        }
      }
    }
  } while (iVar6 != 3);
LAB_0011cf61:
  std::unique_lock<std::mutex>::unlock(&local_168);
  if (((this->super_BaseSocketImpl).m_iError == 0) &&
     (iVar6 = shutdown((this->super_BaseSocketImpl).m_fSock,1), iVar6 != 0)) {
    piVar13 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar13;
    (this->super_BaseSocketImpl).m_iErrLoc = 4;
  }
  LOCK();
  paVar2 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar2->super___atomic_base<unsigned_char>)._M_i =
       (paVar2->super___atomic_base<unsigned_char>)._M_i | 2;
  UNLOCK();
  paVar2 = &(this->super_BaseSocketImpl).m_iShutDownState;
  LOCK();
  bVar18 = (paVar2->super___atomic_base<unsigned_char>)._M_i == '\x03';
  if (bVar18) {
    (paVar2->super___atomic_base<unsigned_char>)._M_i = '\x0f';
  }
  UNLOCK();
  if (bVar18) {
    iVar6 = (this->super_BaseSocketImpl).m_fSock;
    if (iVar6 != -1) {
      close(iVar6);
    }
    (this->super_BaseSocketImpl).m_fSock = -1;
    if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
        (_Manager_type)0x0 ||
        (this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
        (_Manager_type)0x0) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_168);
  return;
}

Assistant:

void UdpSocketImpl::WriteThread()
{

    unique_lock<mutex> lock(m_mxWrite);

    while (m_bCloseReq == false || m_atOutBytes != 0)
    {
        if (m_bCloseReq == false && m_atOutBytes == 0)
            m_cv.wait(lock, [&]() noexcept { return m_atOutBytes == 0 ? m_bCloseReq : true; });

        if (m_atOutBytes != 0)
        {
            fd_set writefd{}, errorfd{};
            struct timeval timeout{};

            timeout.tv_sec = 1;
            timeout.tv_usec = 0;
            FD_ZERO(&writefd);
            FD_ZERO(&errorfd);

            FD_SET(m_fSock, &writefd);
            FD_SET(m_fSock, &errorfd);

            if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) == 0)
            {
                if (m_bCloseReq == false) continue;
                break;
            }

            if (FD_ISSET(m_fSock, &errorfd))
            {
                if (m_iError == 0)
                {
                    socklen_t iLen = sizeof(m_iError);
                    getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                    m_iErrLoc = 5;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                }
                break;
            }

            m_mxOutDeque.lock();
            DATA data = move(m_quOutData.front());
            m_quOutData.pop_front();
            m_atOutBytes -= BUFLEN(data);
            m_mxOutDeque.unlock();

            struct addrinfo *lstAddr = nullptr;
            const size_t nPosS = ADDRESS(data).find('[');
            const size_t nPosE = ADDRESS(data).find(']');
            if (nPosS != string::npos && nPosE != string::npos)
            {
                if (::getaddrinfo(ADDRESS(data).substr(nPosS + 1, nPosE - 1).c_str(), ADDRESS(data).substr(nPosE + 2).c_str(), nullptr, &lstAddr) != 0)
                    break;    // we return 0, because of a wrong address
            }
            else
            {
                const size_t nPos = ADDRESS(data).find(':');
                if (nPos != string::npos)
                {
                    if (::getaddrinfo(ADDRESS(data).substr(0, nPos).c_str(), ADDRESS(data).substr(nPos + 1).c_str(), nullptr, &lstAddr) != 0)
                        break;    // we return 0, because of a wrong address
                }
                else
                    break;    // we return 0, because of a wrong address
            }

            const uint32_t transferred = ::sendto(m_fSock, reinterpret_cast<const char*>(&BUFFER(data)[0]), static_cast<int>(BUFLEN(data)), 0, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen));
            ::freeaddrinfo(lstAddr);
            if (static_cast<int32_t>(transferred) <= 0)
            {
                m_iError = WSAGetLastError();
                if (m_iError != WSAEWOULDBLOCK)
                {
                    m_iErrLoc = 6;
                    if (m_fErrorParam && m_bStop == false)
                        m_fErrorParam(m_pBkRef, m_pvUserData);
                    else if (m_fError && m_bStop == false)
                        m_fError(m_pBkRef);
                    break;
                }
                // Put the not send bytes back into the que if it is not a SSL connection. A SSL connection has the bytes still available
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data));
                copy_n(&BUFFER(data)[0], BUFLEN(data), &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += BUFLEN(data);
                m_quOutData.emplace_front(move(tmp), BUFLEN(data), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
            else if (transferred < BUFLEN(data)) // Less bytes send as buffer size, we put the rast back in your que
            {
                auto tmp = make_unique<uint8_t[]>(BUFLEN(data) - transferred);
                copy_n(&BUFFER(data)[transferred], BUFLEN(data) - transferred, &tmp[0]);
                m_mxOutDeque.lock();
                m_atOutBytes += (BUFLEN(data) - transferred);
                m_quOutData.emplace_front(move(tmp), (BUFLEN(data) - transferred), ADDRESS(data));
                m_mxOutDeque.unlock();
            }
        }
    }

    lock.unlock();

    // if we get out of the while loop, the stop request was send or we have an error
    if (m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_SEND) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
            m_iErrLoc = 4;
        }
    }
    m_iShutDownState |= 2;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}